

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

void __thiscall Samba::writeByte(Samba *this,uint32_t addr,uint8_t value)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  uint8_t cmd [14];
  
  uVar4 = CONCAT71(in_register_00000011,value) & 0xffffffff;
  if (this->_debug == true) {
    printf("%s(addr=%#x,value=%#x)\n","writeByte",(ulong)addr,uVar4);
  }
  snprintf((char *)cmd,0xe,"O%08X,%02X#",(ulong)addr,uVar4);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,0xd);
  if (iVar2 == 0xd) {
    if (this->_isUsb == true) {
      (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t
         .super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
         super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[10])();
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001175a0;
  __cxa_throw(puVar3,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::writeByte(uint32_t addr, uint8_t value)
{
    uint8_t cmd[14];

    if (_debug)
        printf("%s(addr=%#x,value=%#x)\n", __FUNCTION__, addr, value);

    snprintf((char*) cmd, sizeof(cmd), "O%08X,%02X#", addr, value);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) -  1)
        throw SambaError();

    // The SAM firmware has a bug that if the command and binary data
    // are received in the same USB data packet, then the firmware
    // gets confused.  Even though the writes are separated in the code,
    // USB drivers often do write combining which can put them together
    // in the same USB data packet.  To avoid this, we call the serial
    // port object's flush method before writing the data.
    if (_isUsb)
        _port->flush();
}